

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceOptions::InternalSwap(ServiceOptions *this,ServiceOptions *other)

{
  undefined4 uVar1;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff68;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffffa0;
  ExtensionSet *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  internal::ExtensionSet::Swap
            ((ExtensionSet *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 0x20);
  uVar1 = in_RDI[1].super_RepeatedPtrFieldBase.current_size_;
  if ((uVar1 & 1) != 1) {
    in_stack_ffffffffffffffa0 = this_00;
    if (((uint)*(undefined8 *)this_00 & 1) != 1) goto LAB_00510401;
  }
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (this_00);
    in_stack_ffffffffffffff68 = this_00;
  }
  else {
    internal::
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow
              ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff68 = this_00;
  }
  internal::InternalMetadataWithArena::DoSwap
            ((InternalMetadataWithArena *)in_RDI,(UnknownFieldSet *)in_stack_ffffffffffffff68);
LAB_00510401:
  std::swap<unsigned_int>
            ((uint *)&in_RDI[1].super_RepeatedPtrFieldBase.rep_,(uint *)(in_RSI + 0x28));
  RepeatedPtrField<google::protobuf::UninterpretedOption>::InternalSwap
            (in_RDI,(RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                    in_stack_ffffffffffffff68);
  std::swap<bool>((bool *)(in_RDI + 3),(bool *)(in_RSI + 0x48));
  return;
}

Assistant:

void ServiceOptions::InternalSwap(ServiceOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  swap(deprecated_, other->deprecated_);
}